

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Camera::writeTo(Camera *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  anon_struct_72_6_54767870_for_simplified *in_RDI;
  
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<pbrt::math::affine3f>(in_RSI,(affine3f *)in_RDI);
  BinaryWriter::write<pbrt::Camera::_unnamed_type_1_>(in_RSI,in_RDI);
  return 5;
}

Assistant:

int Camera::writeTo(BinaryWriter &binary) 
  {
    binary.write(fov);
    binary.write(focalDistance);
    binary.write(lensRadius);
    binary.write(frame);
    binary.write(simplified);
    return TYPE_CAMERA;
  }